

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# greg.c
# Opt level: O1

int yy_definition(GREG *G)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  iVar1 = G->pos;
  iVar2 = G->thunkpos;
  yyDo(G,yyPush,1,0,"yyPush");
  iVar3 = yy_identifier(G);
  if (iVar3 != 0) {
    yyDo(G,yySet,-1,0,"yySet");
    yyDo(G,yy_1_definition,G->begin,G->end,"yy_1_definition");
    iVar3 = yy_EQUAL(G);
    if ((iVar3 != 0) && (iVar3 = yy_expression(G), iVar3 != 0)) {
      yyDo(G,yy_2_definition,G->begin,G->end,"yy_2_definition");
      iVar1 = G->pos;
      iVar2 = G->thunkpos;
      iVar3 = yymatchChar(G,0x3b);
      if (iVar3 == 0) {
        G->pos = iVar1;
        G->thunkpos = iVar2;
        G->pos = iVar1;
        G->thunkpos = iVar2;
      }
      else {
        yy__(G);
      }
      yyDo(G,yyPop,1,0,"yyPop");
      return 1;
    }
  }
  G->pos = iVar1;
  G->thunkpos = iVar2;
  return 0;
}

Assistant:

YY_RULE(int) yy_definition(GREG *G)
{  int yypos0= G->pos, yythunkpos0= G->thunkpos;  yyDo(G, yyPush, 1, 0, "yyPush");
  yyprintfv((stderr, "%s\n", "definition"));
  if (!yy_identifier(G))  goto l104;
  yyDo(G, yySet, -1, 0, "yySet");
  yyDo(G, yy_1_definition, G->begin, G->end, "yy_1_definition");
  if (!yy_EQUAL(G))  goto l104;
  if (!yy_expression(G))  goto l104;
  yyDo(G, yy_2_definition, G->begin, G->end, "yy_2_definition");

  {  int yypos105= G->pos, yythunkpos105= G->thunkpos;  if (!yy_SEMICOLON(G))  goto l105;
  goto l106;
  l105:;	  G->pos= yypos105; G->thunkpos= yythunkpos105;
  }
  l106:;	  yyprintf((stderr, "  ok   definition"));
  yyprintfGcontext;
  yyprintf((stderr, "\n"));
  yyDo(G, yyPop, 1, 0, "yyPop");
  return 1;
  l104:;	  G->pos= yypos0; G->thunkpos= yythunkpos0;  yyprintfv((stderr, "  fail %s", "definition"));
  yyprintfvGcontext;
  yyprintfv((stderr, "\n"));

  return 0;
}